

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

Aig_Man_t * Saig_ManRetimeDupForward(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  char *pcVar1;
  void *pvVar2;
  int iVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  p_00->nRegs = vCut->nSize;
  p_00->nTruePis = p->nTruePis;
  p_00->nTruePos = p->nTruePos;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar12 = 0;
    do {
      if (p->vCis->nSize <= lVar12) goto LAB_00660d34;
      pvVar2 = p->vCis->pArray[lVar12];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nTruePis);
  }
  if (0 < vCut->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = vCut->pArray[lVar12];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(ulong *)((long)pvVar2 + 0x28) =
           (ulong)(*(uint *)((long)pvVar2 + 0x18) >> 3 & 1) ^ (ulong)pAVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCut->nSize);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      Saig_ManRetimeDup_rec
                (p_00,(Aig_Obj_t *)
                      (*(ulong *)((long)pVVar7->pArray[lVar12] + 8) & 0xfffffffffffffffe));
      lVar12 = lVar12 + 1;
      pVVar7 = p->vCos;
    } while (lVar12 < pVVar7->nSize);
  }
  if (0 < p->nTruePos) {
    lVar12 = 0;
    do {
      if (p->vCos->nSize <= lVar12) goto LAB_00660d34;
      pvVar2 = p->vCos->pArray[lVar12];
      if (((ulong)pvVar2 & 1) != 0) goto LAB_00660d53;
      uVar11 = *(ulong *)((long)pvVar2 + 8);
      uVar8 = uVar11 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar11 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Aig_ObjCreateCo(p_00,pAVar6);
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nTruePos);
  }
  if (0 < p->nRegs) {
    iVar3 = 0;
    do {
      uVar9 = p->nTruePos + iVar3;
      if (((int)uVar9 < 0) || (p->vCos->nSize <= (int)uVar9)) goto LAB_00660d34;
      pvVar2 = p->vCos->pArray[uVar9];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_00660d53:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar11 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28);
      }
      *(ulong *)((long)pvVar2 + 0x28) = uVar11;
      iVar3 = iVar3 + 1;
    } while (iVar3 < p->nRegs);
  }
  if (0 < p->nRegs) {
    iVar3 = 0;
    do {
      uVar9 = p->nTruePos + iVar3;
      if (((((int)uVar9 < 0) || (p->vCos->nSize <= (int)uVar9)) ||
          (uVar10 = p->nTruePis + iVar3, (int)uVar10 < 0)) || (p->vCis->nSize <= (int)uVar10)) {
LAB_00660d34:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(undefined8 *)((long)p->vCis->pArray[uVar10] + 0x28) =
           *(undefined8 *)((long)p->vCos->pArray[uVar9] + 0x28);
      iVar3 = iVar3 + 1;
    } while (iVar3 < p->nRegs);
  }
  if (0 < vCut->nSize) {
    lVar12 = 0;
    do {
      if (0xfffffffd < (*(uint *)((long)vCut->pArray[lVar12] + 0x18) & 7) - 7) {
        *(undefined8 *)((long)vCut->pArray[lVar12] + 0x28) = 0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCut->nSize);
  }
  if (0 < vCut->nSize) {
    lVar12 = 0;
    do {
      pAVar6 = (Aig_Obj_t *)vCut->pArray[lVar12];
      Saig_ManRetimeDup_rec(p_00,pAVar6);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)(*(uint *)&pAVar6->field_0x18 >> 3 & 1) ^
                           (ulong)(pAVar6->field_5).pData));
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCut->nSize);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupForward( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nRegs = Vec_PtrSize(vCut);
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = p->nTruePos;
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi(pNew), pObj->fPhase );
    // duplicate logic above the cut
    Aig_ManForEachCo( p, pObj, i )
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
    // create the true POs
    Saig_ManForEachPo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // remember value in LI
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjChild0Copy(pObj);
    // transfer values from the LIs to the LOs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLo->pData = pObjLi->pData;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = NULL;
    // duplicate logic below the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)pObj->pData, pObj->fPhase) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}